

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O2

token * parse_for_statement(dmr_C *C,token *token,statement *stmt)

{
  int iVar1;
  token *ptVar2;
  statement *psVar3;
  expression *local_58;
  expression *e3;
  statement *iterator;
  expression *e2;
  symbol_list *syms;
  expression *e1;
  
  start_iterator(C,stmt);
  ptVar2 = dmrC_expect_token(C,token->next,0x28,"after \'for\'");
  e2 = (expression *)0x0;
  syms = (symbol_list *)0x0;
  iVar1 = dmrC_lookup_type(ptVar2);
  if (iVar1 == 0) {
    ptVar2 = dmrC_parse_expression(C,ptVar2,(expression **)&syms);
    ptVar2 = dmrC_expect_token(C,ptVar2,0x3b,"in \'for\'");
  }
  else {
    ptVar2 = dmrC_external_declaration(C,ptVar2,(symbol_list **)&e2,validate_for_loop_decl);
  }
  ptVar2 = dmrC_parse_expression(C,ptVar2,(expression **)&iterator);
  ptVar2 = dmrC_expect_token(C,ptVar2,0x3b,"in \'for\'");
  ptVar2 = dmrC_parse_expression(C,ptVar2,&local_58);
  ptVar2 = dmrC_expect_token(C,ptVar2,0x29,"in \'for\'");
  ptVar2 = statement(C,ptVar2,(statement **)&e3);
  (stmt->field_2).field_11.range_high = e2;
  psVar3 = make_statement(C,(expression *)syms);
  (stmt->field_2).field_4.args = psVar3;
  (stmt->field_2).field_8.iterator_pre_condition = (expression *)iterator;
  psVar3 = make_statement(C,local_58);
  (stmt->field_2).field_8.iterator_post_statement = psVar3;
  (stmt->field_2).field_8.iterator_post_condition = (expression *)0x0;
  (stmt->field_2).field_8.iterator_statement = (statement *)e3;
  dmrC_end_symbol_scope(C);
  return ptVar2;
}

Assistant:

static struct token *parse_for_statement(struct dmr_C *C, struct token *token, struct statement *stmt)
{
	struct symbol_list *syms;
	struct expression *e1, *e2, *e3;
	struct statement *iterator;

	start_iterator(C, stmt);
	token = dmrC_expect_token(C, token->next, '(', "after 'for'");

	syms = NULL;
	e1 = NULL;
	/* C99 variable declaration? */
	if (dmrC_lookup_type(token)) {
		token = dmrC_external_declaration(C, token, &syms, validate_for_loop_decl);
	} else {
		token = dmrC_parse_expression(C, token, &e1);
		token = dmrC_expect_token(C, token, ';', "in 'for'");
	}
	token = dmrC_parse_expression(C, token, &e2);
	token = dmrC_expect_token(C, token, ';', "in 'for'");
	token = dmrC_parse_expression(C, token, &e3);
	token = dmrC_expect_token(C, token, ')', "in 'for'");
	token = statement(C, token, &iterator);

	stmt->iterator_syms = syms;
	stmt->iterator_pre_statement = make_statement(C, e1);
	stmt->iterator_pre_condition = e2;
	stmt->iterator_post_statement = make_statement(C, e3);
	stmt->iterator_post_condition = NULL;
	stmt->iterator_statement = iterator;
	end_iterator(C, stmt);

	return token;
}